

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test7::getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,
          _variable_type input_variable_type,uint array_size)

{
  uint uVar1;
  ostream *poVar2;
  _variable_type type;
  char *pcVar3;
  stringstream array_index_stringstream;
  stringstream array_size_stringstream;
  stringstream result_sstream;
  string asStack_518 [32];
  string local_4f8 [32];
  string local_4d8;
  stringstream local_4b8 [16];
  ostream local_4a8;
  stringstream local_330 [16];
  ostream local_320;
  stringstream local_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_4b8);
  std::__cxx11::stringstream::stringstream(local_330);
  if (1 < array_size) {
    std::operator<<(&local_4a8,"[0]");
    poVar2 = std::operator<<(&local_320,"[");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"]");
  }
  if ((input_variable_type - VARIABLE_TYPE_DMAT2 < 0x1a) &&
     ((0x3fe01ffU >> (input_variable_type - VARIABLE_TYPE_DMAT2 & 0x1f) & 1) != 0)) {
    pcVar3 = "[0].x";
  }
  else {
    uVar1 = Utils::getNumberOfComponentsForVariableType(input_variable_type);
    if (uVar1 < 2) goto LAB_009ef09e;
    pcVar3 = "[0]";
  }
  std::operator<<(&local_4a8,pcVar3);
LAB_009ef09e:
  poVar2 = std::operator<<(&local_198,"#version 400\n\nin ");
  Utils::getVariableTypeString_abi_cxx11_(&local_4d8,(Utils *)(ulong)input_variable_type,type);
  poVar2 = std::operator<<(poVar2,(string *)&local_4d8);
  poVar2 = std::operator<<(poVar2," test_input");
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<(poVar2,local_4f8);
  poVar2 = std::operator<<(poVar2,
                           ";\n\nout float test_output;\n\nvoid main()\n{\n    if (test_input");
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<(poVar2,asStack_518);
  std::operator<<(poVar2,
                  " > 2.0)\n    {\n        test_output = 1.0;\n    }\n    else\n    {\n        test_output = 3.0;\n    }\n}\n"
                 );
  std::__cxx11::string::~string(asStack_518);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_4b8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput(
	Utils::_variable_type input_variable_type, unsigned int array_size)
{
	std::stringstream result_sstream;
	std::stringstream array_index_stringstream;
	std::stringstream array_size_stringstream;

	if (array_size > 1)
	{
		array_index_stringstream << "[0]";
		array_size_stringstream << "[" << array_size << "]";
	}

	if (Utils::isMatrixVariableType(input_variable_type))
	{
		array_index_stringstream << "[0].x";
	}
	else if (Utils::getNumberOfComponentsForVariableType(input_variable_type) > 1)
	{
		array_index_stringstream << "[0]";
	}

	result_sstream << "#version 400\n"
					  "\n"
					  "in "
				   << Utils::getVariableTypeString(input_variable_type) << " test_input"
				   << array_size_stringstream.str() << ";\n"
													   "\n"
													   "out float test_output;\n"
													   "\n"
													   "void main()\n"
													   "{\n"
													   "    if (test_input"
				   << array_index_stringstream.str() << " > 2.0)\n"
														"    {\n"
														"        test_output = 1.0;\n"
														"    }\n"
														"    else\n"
														"    {\n"
														"        test_output = 3.0;\n"
														"    }\n"
														"}\n";

	return result_sstream.str();
}